

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

string * cmRemoveQuotes_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  size_type sVar1;
  const_reference pvVar2;
  allocator<char> local_21;
  undefined1 local_20 [8];
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  local_20 = (undefined1  [8])str._M_len;
  str_local._M_str = (char *)__return_storage_ptr__;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  if (1 < sVar1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
    if (*pvVar2 == '\"') {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::back
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
      if (*pvVar2 == '\"') {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_21);
  std::allocator<char>::~allocator(&local_21);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRemoveQuotes(cm::string_view str)
{
  // We process only strings that have two quotes at least.
  // Also front() and back() are only defined behavior on non empty strings.
  if (str.size() >= 2 &&    //
      str.front() == '"' && //
      str.back() == '"') {
    // Remove a quote from the front and back
    str.remove_prefix(1);
    str.remove_suffix(1);
  }
  return std::string(str);
}